

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_resize2.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  bool bVar14;
  char *pcVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  ALLEGRO_EVENT event;
  int local_78;
  undefined8 local_70;
  int local_58;
  int local_54;
  
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    pcVar15 = "Could not init Allegro.\n";
  }
  else {
    al_install_keyboard();
    al_init_image_addon();
    al_init_font_addon();
    al_set_new_display_flags(0x50);
    lVar9 = al_create_display(0x280,0x1e0);
    if (lVar9 == 0) {
      pcVar15 = "Unable to set any graphic mode\n";
    }
    else {
      al_set_new_bitmap_flags(1);
      lVar10 = al_load_bitmap("data/mysha.pcx");
      if (lVar10 != 0) {
        uVar11 = al_create_builtin_font();
        uVar12 = al_create_event_queue();
        uVar13 = al_get_display_event_source(lVar9);
        al_register_event_source(uVar12,uVar13);
        uVar13 = al_get_keyboard_event_source();
        al_register_event_source(uVar12,uVar13);
        bVar14 = true;
        do {
          if (bVar14) {
            cVar1 = al_is_event_queue_empty(uVar12);
            if (cVar1 != '\0') {
              bVar14 = false;
              al_map_rgb(0xff,0,0);
              al_clear_to_color();
              iVar2 = al_get_bitmap_width(lVar10);
              iVar3 = al_get_bitmap_height(lVar10);
              iVar4 = al_get_display_width(lVar9);
              iVar5 = al_get_display_height(lVar9);
              uVar17 = 0;
              al_draw_scaled_bitmap
                        (0,0,(float)iVar2,(float)iVar3,0,0,(float)iVar4,(float)iVar5,lVar10,0);
              uVar16 = al_map_rgb(0xff,0xff,0);
              al_get_font_line_height(uVar11);
              uVar6 = al_get_display_width(lVar9);
              uVar7 = al_get_display_height(lVar9);
              uVar8 = al_get_display_flags(lVar9);
              pcVar15 = "yes";
              if ((uVar8 >> 0xd & 1) == 0) {
                pcVar15 = "no";
              }
              al_draw_multiline_textf
                        (uVar16,uVar17,0,0,uVar11,0,
                         "size: %d x %d\nmaximized: %s\n+ key to maximize\n- key to un-maximize",
                         uVar6,uVar7,pcVar15);
              al_flip_display();
            }
          }
          al_wait_for_event(uVar12);
          if (local_78 == 0x29) {
            al_acknowledge_resize(local_70);
            bVar14 = true;
          }
          if (local_78 == 0x28) {
            bVar14 = true;
          }
          if ((local_78 == 10) && (local_58 == 0x3b)) break;
          if ((local_78 == 0xb) && (local_54 == 0x2b)) {
            al_set_display_flag(lVar9,0x2000,1);
          }
          if ((local_78 == 0xb) && (local_54 == 0x2d)) {
            al_set_display_flag(lVar9,0x2000,0);
          }
        } while (local_78 != 0x2a);
        al_destroy_bitmap(lVar10);
        al_destroy_display(lVar9);
        return 0;
      }
      pcVar15 = "Unable to load image\n";
    }
  }
  abort_example(pcVar15);
  iVar2 = __cxa_atexit();
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_EVENT event;
   ALLEGRO_FONT *font;
   bool redraw;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_install_keyboard();
   al_init_image_addon();
   al_init_font_addon();

   al_set_new_display_flags(ALLEGRO_RESIZABLE |
      ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Unable to set any graphic mode\n");
   }

   al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   bmp = al_load_bitmap("data/mysha.pcx");
   if (!bmp) {
      abort_example("Unable to load image\n");
   }

   font = al_create_builtin_font();

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_keyboard_event_source());

   redraw = true;
   while (true) {
      if (redraw && al_is_event_queue_empty(queue)) {
         al_clear_to_color(al_map_rgb(255, 0, 0));
         al_draw_scaled_bitmap(bmp,
            0, 0, al_get_bitmap_width(bmp), al_get_bitmap_height(bmp),
            0, 0, al_get_display_width(display), al_get_display_height(display),
            0);
      al_draw_multiline_textf(font, al_map_rgb(255, 255, 0), 0, 0, 640,
         al_get_font_line_height(font), 0,
         "size: %d x %d\n"
         "maximized: %s\n"
         "+ key to maximize\n"
         "- key to un-maximize",
         al_get_display_width(display),
         al_get_display_height(display),
         al_get_display_flags(display) & ALLEGRO_MAXIMIZED ? "yes" :
         "no");

         al_flip_display();
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_RESIZE) {
         al_acknowledge_resize(event.display.source);
         redraw = true;
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_EXPOSE) {
         redraw = true;
      }
      if (event.type == ALLEGRO_EVENT_KEY_DOWN &&
            event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
         break;
      }
      if (event.type == ALLEGRO_EVENT_KEY_CHAR &&
            event.keyboard.unichar == '+') {
         al_set_display_flag(display, ALLEGRO_MAXIMIZED, true);
      }
      if (event.type == ALLEGRO_EVENT_KEY_CHAR &&
            event.keyboard.unichar == '-') {
         al_set_display_flag(display, ALLEGRO_MAXIMIZED, false);
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
   }

   al_destroy_bitmap(bmp);
   al_destroy_display(display);

   return 0;

}